

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

void __thiscall aeron::archive::Context::conclude(Context *this)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  Context *__tmp;
  long *local_178 [2];
  long local_168 [2];
  undefined1 local_158 [32];
  _Any_data local_138;
  _func_int **local_128;
  _Invoker_type p_Stack_120;
  _Any_data local_118;
  _func_int **local_108;
  _Invoker_type p_Stack_100;
  _Any_data local_f8;
  _func_int **local_e8;
  _Invoker_type p_Stack_e0;
  _Any_data local_d8;
  _func_int **local_c8;
  _Invoker_type p_Stack_c0;
  _Any_data local_b8;
  _func_int **local_a8;
  _Invoker_type p_Stack_a0;
  _Any_data local_98;
  _func_int **local_88;
  _Invoker_type p_Stack_80;
  _Any_data local_78;
  _func_int **local_68;
  _Invoker_type p_Stack_60;
  _Any_data local_58;
  _func_int **local_48;
  _Invoker_type p_Stack_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined2 local_28;
  
  if ((this->aeronDirectoryName_)._M_string_length == 0) {
    memset(local_158,0,0x138);
    aeron::Context::defaultAeronPath_abi_cxx11_();
    local_138 = (_Any_data)ZEXT816(0x13b984);
    p_Stack_120 = std::
                  _Function_handler<void_(const_std::exception_&),_void_(*)(const_std::exception_&)>
                  ::_M_invoke;
    local_128 = (_func_int **)
                std::
                _Function_handler<void_(const_std::exception_&),_void_(*)(const_std::exception_&)>::
                _M_manager;
    local_118 = (_Any_data)ZEXT816(0x13ba68);
    p_Stack_100 = std::
                  _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
                  ::_M_invoke;
    local_108 = (_func_int **)
                std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
                ::_M_manager;
    local_f8 = (_Any_data)ZEXT816(0x13ba68);
    p_Stack_e0 = std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
                 ::_M_invoke;
    local_e8 = (_func_int **)
               std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
               ::_M_manager;
    local_d8 = (_Any_data)ZEXT816(0x13ba69);
    p_Stack_c0 = std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_long),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_long)>
                 ::_M_invoke;
    local_c8 = (_func_int **)
               std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_long),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_long)>
               ::_M_manager;
    local_b8 = (_Any_data)ZEXT816(0x133602);
    p_Stack_a0 = std::_Function_handler<void_(aeron::Image_&),_void_(*)(aeron::Image_&)>::_M_invoke;
    local_a8 = (_func_int **)
               std::_Function_handler<void_(aeron::Image_&),_void_(*)(aeron::Image_&)>::_M_manager;
    local_98 = (_Any_data)ZEXT816(0x133603);
    p_Stack_80 = std::_Function_handler<void_(aeron::Image_&),_void_(*)(aeron::Image_&)>::_M_invoke;
    local_88 = (_func_int **)
               std::_Function_handler<void_(aeron::Image_&),_void_(*)(aeron::Image_&)>::_M_manager;
    local_78 = (_Any_data)ZEXT816(0x13ba6a);
    p_Stack_60 = std::
                 _Function_handler<void_(aeron::concurrent::CountersReader_&,_long,_int),_void_(*)(aeron::concurrent::CountersReader_&,_long,_int)>
                 ::_M_invoke;
    local_68 = (_func_int **)
               std::
               _Function_handler<void_(aeron::concurrent::CountersReader_&,_long,_int),_void_(*)(aeron::concurrent::CountersReader_&,_long,_int)>
               ::_M_manager;
    local_58 = (_Any_data)ZEXT816(0x13ba6b);
    p_Stack_40 = std::
                 _Function_handler<void_(aeron::concurrent::CountersReader_&,_long,_int),_void_(*)(aeron::concurrent::CountersReader_&,_long,_int)>
                 ::_M_invoke;
    local_48 = (_func_int **)
               std::
               _Function_handler<void_(aeron::concurrent::CountersReader_&,_long,_int),_void_(*)(aeron::concurrent::CountersReader_&,_long,_int)>
               ::_M_manager;
    local_38 = 0xffffffff;
    uStack_34 = 0xffffffff;
    uStack_30 = 0xffffffff;
    uStack_2c = 0xffffffff;
    local_28._0_1_ = false;
    local_28._1_1_ = false;
    aeron::Context::defaultAeronPath_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&this->aeronDirectoryName_,(string *)local_178);
    if (local_178[0] != local_168) {
      operator_delete(local_178[0],local_168[0] + 1);
    }
    aeron::Context::~Context((Context *)local_158);
  }
  if ((this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    memset(local_158,0,0x138);
    aeron::Context::defaultAeronPath_abi_cxx11_();
    local_138._M_unused._M_object = defaultErrorHandler;
    local_138._8_8_ = 0;
    local_128 = (_func_int **)
                std::
                _Function_handler<void_(const_std::exception_&),_void_(*)(const_std::exception_&)>::
                _M_manager;
    p_Stack_120 = std::
                  _Function_handler<void_(const_std::exception_&),_void_(*)(const_std::exception_&)>
                  ::_M_invoke;
    local_118._M_unused._M_object = defaultOnNewPublicationHandler;
    local_118._8_8_ = 0;
    local_108 = (_func_int **)
                std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
                ::_M_manager;
    p_Stack_100 = std::
                  _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
                  ::_M_invoke;
    local_f8._M_unused._M_object = defaultOnNewPublicationHandler;
    local_f8._8_8_ = 0;
    local_e8 = (_func_int **)
               std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
               ::_M_manager;
    p_Stack_e0 = std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
                 ::_M_invoke;
    local_d8._M_unused._M_object = defaultOnNewSubscriptionHandler;
    local_d8._8_8_ = 0;
    local_c8 = (_func_int **)
               std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_long),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_long)>
               ::_M_manager;
    p_Stack_c0 = std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_long),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_long)>
                 ::_M_invoke;
    local_b8._M_unused._M_object = defaultOnAvailableImageHandler;
    local_b8._8_8_ = 0;
    local_a8 = (_func_int **)
               std::_Function_handler<void_(aeron::Image_&),_void_(*)(aeron::Image_&)>::_M_manager;
    p_Stack_a0 = std::_Function_handler<void_(aeron::Image_&),_void_(*)(aeron::Image_&)>::_M_invoke;
    local_98._M_unused._M_object = defaultOnUnavailableImageHandler;
    local_98._8_8_ = 0;
    local_88 = (_func_int **)
               std::_Function_handler<void_(aeron::Image_&),_void_(*)(aeron::Image_&)>::_M_manager;
    p_Stack_80 = std::_Function_handler<void_(aeron::Image_&),_void_(*)(aeron::Image_&)>::_M_invoke;
    local_78._M_unused._M_object = defaultOnAvailableCounterHandler;
    local_78._8_8_ = 0;
    local_68 = (_func_int **)
               std::
               _Function_handler<void_(aeron::concurrent::CountersReader_&,_long,_int),_void_(*)(aeron::concurrent::CountersReader_&,_long,_int)>
               ::_M_manager;
    p_Stack_60 = std::
                 _Function_handler<void_(aeron::concurrent::CountersReader_&,_long,_int),_void_(*)(aeron::concurrent::CountersReader_&,_long,_int)>
                 ::_M_invoke;
    local_58._M_unused._M_object = defaultOnUnavailableCounterHandler;
    local_58._8_8_ = 0;
    local_48 = (_func_int **)
               std::
               _Function_handler<void_(aeron::concurrent::CountersReader_&,_long,_int),_void_(*)(aeron::concurrent::CountersReader_&,_long,_int)>
               ::_M_manager;
    p_Stack_40 = std::
                 _Function_handler<void_(aeron::concurrent::CountersReader_&,_long,_int),_void_(*)(aeron::concurrent::CountersReader_&,_long,_int)>
                 ::_M_invoke;
    local_38 = 0xffffffff;
    uStack_34 = 0xffffffff;
    uStack_30 = 0xffffffff;
    uStack_2c = 0xffffffff;
    local_28._0_1_ = false;
    local_28._1_1_ = false;
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x148);
    p_Var5->_M_use_count = 1;
    p_Var5->_M_weak_count = 1;
    p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00164650;
    p_Var2 = p_Var5 + 2;
    p_Var5[1]._vptr__Sp_counted_base = (_func_int **)p_Var2;
    pcVar1 = local_158 + 0x10;
    if ((pointer)local_158._0_8_ == pcVar1) {
      p_Var2->_vptr__Sp_counted_base = (_func_int **)CONCAT71(local_158._17_7_,local_158[0x10]);
      p_Var5[2]._M_use_count = local_158._24_4_;
      p_Var5[2]._M_weak_count = local_158._28_4_;
    }
    else {
      (((element_type *)(p_Var5 + 1))->m_dirName)._M_dataplus._M_p = (pointer)local_158._0_8_;
      p_Var2->_vptr__Sp_counted_base = (_func_int **)CONCAT71(local_158._17_7_,local_158[0x10]);
    }
    p_Var5[1]._M_use_count = local_158._8_4_;
    p_Var5[1]._M_weak_count = local_158._12_4_;
    local_158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_158[0x10] = '\0';
    p_Var5[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[3]._M_use_count = 0;
    p_Var5[3]._M_weak_count = 0;
    *(_Invoker_type *)&p_Var5[4]._M_use_count = p_Stack_120;
    if (local_128 != (_func_int **)0x0) {
      p_Var5[3]._vptr__Sp_counted_base = (_func_int **)local_138._M_unused._0_8_;
      p_Var5[3]._M_use_count = local_138._8_4_;
      p_Var5[3]._M_weak_count = local_138._12_4_;
      p_Var5[4]._vptr__Sp_counted_base = local_128;
      local_128 = (_func_int **)0x0;
      p_Stack_120 = (_Invoker_type)0x0;
    }
    p_Var5[5]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[5]._M_use_count = 0;
    p_Var5[5]._M_weak_count = 0;
    p_Var5[6]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(_Invoker_type *)&p_Var5[6]._M_use_count = p_Stack_100;
    if (local_108 != (_func_int **)0x0) {
      p_Var5[5]._vptr__Sp_counted_base = (_func_int **)local_118._M_unused._0_8_;
      p_Var5[5]._M_use_count = local_118._8_4_;
      p_Var5[5]._M_weak_count = local_118._12_4_;
      p_Var5[6]._vptr__Sp_counted_base = local_108;
      local_108 = (_func_int **)0x0;
      p_Stack_100 = (_Invoker_type)0x0;
    }
    p_Var5[7]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[7]._M_use_count = 0;
    p_Var5[7]._M_weak_count = 0;
    p_Var5[8]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(_Invoker_type *)&p_Var5[8]._M_use_count = p_Stack_e0;
    if (local_e8 != (_func_int **)0x0) {
      p_Var5[7]._vptr__Sp_counted_base = (_func_int **)local_f8._M_unused._0_8_;
      p_Var5[7]._M_use_count = local_f8._8_4_;
      p_Var5[7]._M_weak_count = local_f8._12_4_;
      p_Var5[8]._vptr__Sp_counted_base = local_e8;
      local_e8 = (_func_int **)0x0;
      p_Stack_e0 = (_Invoker_type)0x0;
    }
    p_Var5[9]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[9]._M_use_count = 0;
    p_Var5[9]._M_weak_count = 0;
    p_Var5[10]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(_Invoker_type *)&p_Var5[10]._M_use_count = p_Stack_c0;
    if (local_c8 != (_func_int **)0x0) {
      p_Var5[9]._vptr__Sp_counted_base = (_func_int **)local_d8._M_unused._0_8_;
      p_Var5[9]._M_use_count = local_d8._8_4_;
      p_Var5[9]._M_weak_count = local_d8._12_4_;
      p_Var5[10]._vptr__Sp_counted_base = local_c8;
      local_c8 = (_func_int **)0x0;
      p_Stack_c0 = (_Invoker_type)0x0;
    }
    p_Var5[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[0xb]._M_use_count = 0;
    p_Var5[0xb]._M_weak_count = 0;
    p_Var5[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(_Invoker_type *)&p_Var5[0xc]._M_use_count = p_Stack_a0;
    if (local_a8 != (_func_int **)0x0) {
      p_Var5[0xb]._vptr__Sp_counted_base = (_func_int **)local_b8._M_unused._0_8_;
      p_Var5[0xb]._M_use_count = local_b8._8_4_;
      p_Var5[0xb]._M_weak_count = local_b8._12_4_;
      p_Var5[0xc]._vptr__Sp_counted_base = local_a8;
      local_a8 = (_func_int **)0x0;
      p_Stack_a0 = (_Invoker_type)0x0;
    }
    p_Var5[0xd]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[0xd]._M_use_count = 0;
    p_Var5[0xd]._M_weak_count = 0;
    p_Var5[0xe]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(_Invoker_type *)&p_Var5[0xe]._M_use_count = p_Stack_80;
    if (local_88 != (_func_int **)0x0) {
      p_Var5[0xd]._vptr__Sp_counted_base = (_func_int **)local_98._M_unused._0_8_;
      p_Var5[0xd]._M_use_count = local_98._8_4_;
      p_Var5[0xd]._M_weak_count = local_98._12_4_;
      p_Var5[0xe]._vptr__Sp_counted_base = local_88;
      local_88 = (_func_int **)0x0;
      p_Stack_80 = (_Invoker_type)0x0;
    }
    p_Var5[0xf]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[0xf]._M_use_count = 0;
    p_Var5[0xf]._M_weak_count = 0;
    p_Var5[0x10]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(_Invoker_type *)&p_Var5[0x10]._M_use_count = p_Stack_60;
    if (local_68 != (_func_int **)0x0) {
      p_Var5[0xf]._vptr__Sp_counted_base = (_func_int **)local_78._M_unused._0_8_;
      p_Var5[0xf]._M_use_count = local_78._8_4_;
      p_Var5[0xf]._M_weak_count = local_78._12_4_;
      p_Var5[0x10]._vptr__Sp_counted_base = local_68;
      local_68 = (_func_int **)0x0;
      p_Stack_60 = (_Invoker_type)0x0;
    }
    p_Var5[0x11]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[0x11]._M_use_count = 0;
    p_Var5[0x11]._M_weak_count = 0;
    p_Var5[0x12]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(_Invoker_type *)&p_Var5[0x12]._M_use_count = p_Stack_40;
    if (local_48 != (_func_int **)0x0) {
      p_Var5[0x11]._vptr__Sp_counted_base = (_func_int **)local_58._M_unused._0_8_;
      p_Var5[0x11]._M_use_count = local_58._8_4_;
      p_Var5[0x11]._M_weak_count = local_58._12_4_;
      p_Var5[0x12]._vptr__Sp_counted_base = local_48;
      local_48 = (_func_int **)0x0;
      p_Stack_40 = (_Invoker_type)0x0;
    }
    *(undefined2 *)&p_Var5[0x14]._vptr__Sp_counted_base = local_28;
    p_Var5[0x13]._vptr__Sp_counted_base = (_func_int **)CONCAT44(uStack_34,local_38);
    p_Var5[0x13]._M_use_count = uStack_30;
    p_Var5[0x13]._M_weak_count = uStack_2c;
    (this->aeronContext_).super___shared_ptr<aeron::Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var5 + 1);
    p_Var2 = (this->aeronContext_).super___shared_ptr<aeron::Context,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->aeronContext_).super___shared_ptr<aeron::Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = p_Var5;
    local_158._0_8_ = pcVar1;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    aeron::Context::~Context((Context *)local_158);
    std::__cxx11::string::_M_assign
              ((string *)
               (this->aeronContext_).super___shared_ptr<aeron::Context,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    local_158._0_8_ = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<aeron::Aeron,std::allocator<aeron::Aeron>,aeron::Context&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8),(Aeron **)local_158,
               (allocator<aeron::Aeron> *)local_178,
               (this->aeronContext_).super___shared_ptr<aeron::Context,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    uVar4 = local_158._8_8_;
    uVar3 = local_158._0_8_;
    local_158._0_8_ = (pointer)0x0;
    local_158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
    (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar3;
    (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
    }
  }
  return;
}

Assistant:

void Context::conclude() {
    if (aeronDirectoryName_.empty()) {
        aeronDirectoryName_ = aeron::Context().defaultAeronPath();
    }

    if (!aeron_) {
        aeronContext_ = std::make_shared<aeron::Context>(aeron::Context());
        aeronContext_->aeronDir(aeronDirectoryName_);
        aeron_ = aeron::Aeron::connect(*aeronContext_);
    }
}